

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O0

void resampler_dup_inplace(void *_d,void *_s)

{
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  resampler *r_out;
  resampler *r_in;
  
  *in_RDI = *in_RSI;
  in_RDI[1] = in_RSI[1];
  in_RDI[2] = in_RSI[2];
  in_RDI[3] = in_RSI[3];
  *(undefined8 *)(in_RDI + 4) = *(undefined8 *)(in_RSI + 4);
  *(undefined8 *)(in_RDI + 6) = *(undefined8 *)(in_RSI + 6);
  *(undefined8 *)(in_RDI + 8) = *(undefined8 *)(in_RSI + 8);
  *(undefined8 *)(in_RDI + 10) = *(undefined8 *)(in_RSI + 10);
  *(undefined1 *)(in_RDI + 0xc) = *(undefined1 *)(in_RSI + 0xc);
  *(undefined1 *)((long)in_RDI + 0x31) = *(undefined1 *)((long)in_RSI + 0x31);
  *(undefined1 *)((long)in_RDI + 0x32) = *(undefined1 *)((long)in_RSI + 0x32);
  *(undefined8 *)(in_RDI + 0xe) = *(undefined8 *)(in_RSI + 0xe);
  *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(in_RSI + 0x10);
  memcpy(in_RDI + 0x12,in_RSI + 0x12,0x200);
  memcpy(in_RDI + 0x92,in_RSI + 0x92,0x17c);
  return;
}

Assistant:

void resampler_dup_inplace(void *_d, const void *_s)
{
    const resampler * r_in = ( const resampler * ) _s;
    resampler * r_out = ( resampler * ) _d;

    r_out->write_pos = r_in->write_pos;
    r_out->write_filled = r_in->write_filled;
    r_out->read_pos = r_in->read_pos;
    r_out->read_filled = r_in->read_filled;
    r_out->phase = r_in->phase;
    r_out->phase_inc = r_in->phase_inc;
    r_out->inv_phase = r_in->inv_phase;
    r_out->inv_phase_inc = r_in->inv_phase_inc;
    r_out->quality = r_in->quality;
    r_out->delay_added = r_in->delay_added;
    r_out->delay_removed = r_in->delay_removed;
    r_out->last_amp = r_in->last_amp;
    r_out->accumulator = r_in->accumulator;
    memcpy( r_out->buffer_in, r_in->buffer_in, sizeof(r_in->buffer_in) );
    memcpy( r_out->buffer_out, r_in->buffer_out, sizeof(r_in->buffer_out) );
}